

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O0

double L18_4::use_f<double,L18_4::Fq>(double v,Fq f)

{
  ostream *poVar1;
  void *this;
  double dVar2;
  double v_local;
  Fq f_local;
  
  use_f<double,_L18_4::Fq>::count = use_f<double,_L18_4::Fq>::count + 1;
  v_local = f._z;
  poVar1 = std::operator<<((ostream *)&std::cout," use_f count = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,use_f<double,_L18_4::Fq>::count);
  poVar1 = std::operator<<(poVar1,", &count = ");
  this = (void *)std::ostream::operator<<(poVar1,&use_f<double,_L18_4::Fq>::count);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  dVar2 = Fq::operator()((Fq *)&v_local,v);
  return dVar2;
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }